

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O0

bool __thiscall
YAML::EmitterState::SetBoolFormat(EmitterState *this,EMITTER_MANIP value,value scope)

{
  bool bVar1;
  int in_ESI;
  value in_stack_00000040;
  EMITTER_MANIP in_stack_00000044;
  Setting<YAML::EMITTER_MANIP> *in_stack_00000048;
  EmitterState *in_stack_00000050;
  
  bVar1 = in_ESI - 0xdU < 3;
  if (bVar1) {
    _Set<YAML::EMITTER_MANIP>
              (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040);
  }
  return bVar1;
}

Assistant:

bool EmitterState::SetBoolFormat(EMITTER_MANIP value, FmtScope::value scope) {
  switch (value) {
    case OnOffBool:
    case TrueFalseBool:
    case YesNoBool:
      _Set(m_boolFmt, value, scope);
      return true;
    default:
      return false;
  }
}